

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CZ<double>::CZ(CZ<double> *this,int control,int target,int controlState)

{
  int controlState_local;
  int target_local;
  int control_local;
  CZ<double> *this_local;
  
  QControlledGate2<double>::QControlledGate2
            (&this->super_QControlledGate2<double>,control,controlState);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0017bba0;
  std::make_unique<qclab::qgates::PauliZ<double>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                  ,0x2b,
                  "qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]");
  }
  if (-1 < target) {
    if (control != target) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                  ,0x2c,
                  "qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]");
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                ,0x2b,"qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]")
  ;
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }